

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O2

void __thiscall xLearn::MODEL_TEST_Init_lr_Test::TestBody(MODEL_TEST_Init_lr_Test *this)

{
  real_t *prVar1;
  ulong uVar2;
  char *pcVar3;
  index_t j;
  ulong uVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  AssertHelper local_300;
  AssertionResult gtest_ar;
  index_t param_num_v;
  index_t param_num_w;
  real_t *local_2e0;
  real_t *v;
  Model model_lr;
  HyperParam hyper_param;
  
  Init();
  std::__cxx11::string::assign((char *)&hyper_param.score_func);
  model_lr.score_func_._M_dataplus._M_p = (pointer)&model_lr.score_func_.field_2;
  model_lr.score_func_._M_string_length = 0;
  model_lr.score_func_.field_2._M_local_buf[0] = '\0';
  model_lr.loss_func_._M_dataplus._M_p = (pointer)&model_lr.loss_func_.field_2;
  model_lr.loss_func_._M_string_length = 0;
  model_lr.loss_func_.field_2._M_local_buf[0] = '\0';
  model_lr.param_w_ = (real_t *)0x0;
  model_lr.param_v_ = (real_t *)0x0;
  model_lr.param_b_ = (real_t *)0x0;
  model_lr.param_best_w_ = (real_t *)0x0;
  model_lr.param_best_v_ = (real_t *)0x0;
  model_lr.param_best_b_ = (real_t *)0x0;
  Model::Initialize(&model_lr,&hyper_param.score_func,&hyper_param.loss_func,hyper_param.num_feature
                    ,hyper_param.num_field,hyper_param.num_K,hyper_param.auxiliary_size,0.5);
  prVar1 = model_lr.param_b_;
  param_num_v = 0;
  param_num_w = hyper_param.num_feature * 2;
  local_2e0 = model_lr.param_w_;
  v = model_lr.param_v_;
  local_308.ptr_._0_4_ = model_lr.param_num_w_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"param_num_w","model_lr.GetNumParameter_w()",&param_num_w,
             (uint *)&local_308);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_308);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x86,pcVar3);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_308);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_308.ptr_._0_4_ = model_lr.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"param_num_v","model_lr.GetNumParameter_v()",&param_num_v,
             (uint *)&local_308);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_308);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x87,pcVar3);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_308);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_308.ptr_._0_4_ = param_num_v + 2 + param_num_w;
  local_300.data_._0_4_ = model_lr.param_num_w_ + 2 + model_lr.param_num_v_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"param_num_v+param_num_w+2","model_lr.GetNumParameter()",
             (uint *)&local_308,(uint *)&local_300);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_308);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x88,pcVar3);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_308);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>((internal *)&gtest_ar,"b[0]","0",*prVar1,0.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_308);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x89,pcVar3);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_308);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"b[1]","1.0",prVar1[1],1.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_308);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x8a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_308);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  for (uVar2 = 0; (uint)uVar2 < model_lr.param_num_w_; uVar2 = uVar2 + hyper_param.auxiliary_size) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"w[i]","0.0",local_2e0[uVar2 & 0xffffffff],0.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_308);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_300,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
                 ,0x8d,pcVar3);
      testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
      testing::internal::AssertHelper::~AssertHelper(&local_300);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_308);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    for (uVar4 = 1; uVar4 < hyper_param.auxiliary_size; uVar4 = uVar4 + 1) {
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"w[i+j]","1.0",local_2e0[(uint)uVar2 + (int)uVar4],1.0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_308);
        pcVar3 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_300,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x8f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
        testing::internal::AssertHelper::~AssertHelper(&local_300);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_308);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
  }
  local_308.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<float*,decltype(nullptr)>
            ((internal *)&gtest_ar,"v","nullptr",&v,&local_308.ptr_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_308);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters_test.cc"
               ,0x92,pcVar3);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_308);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  Model::~Model(&model_lr);
  HyperParam::~HyperParam(&hyper_param);
  return;
}

Assistant:

TEST(MODEL_TEST, Init_lr) {
  HyperParam hyper_param = Init();
  hyper_param.score_func = "linear";
  Model model_lr;
  model_lr.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  real_t* b = model_lr.GetParameter_b();
  real_t* w = model_lr.GetParameter_w();
  index_t param_num_w = hyper_param.num_feature * 2;
  real_t* v = model_lr.GetParameter_v();
  index_t param_num_v = 0;
  EXPECT_EQ(param_num_w, model_lr.GetNumParameter_w());
  EXPECT_EQ(param_num_v, model_lr.GetNumParameter_v());
  EXPECT_EQ(param_num_v+param_num_w+2, model_lr.GetNumParameter());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  index_t aux_size = hyper_param.auxiliary_size;
  for (index_t i = 0; i < model_lr.GetNumParameter_w(); i+=aux_size) {
    EXPECT_FLOAT_EQ(w[i], 0.0);
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(w[i+j], 1.0);
    }
  }
  EXPECT_EQ(v, nullptr);
}